

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.cpp
# Opt level: O2

void doDecodeScan(exr_context_t f,pixels *p,int xs,int ys)

{
  bool bVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  char *pcVar6;
  uint uVar7;
  undefined4 in_register_0000000c;
  char *pcVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  int32_t linestride;
  int32_t pixelstride;
  exr_storage_t stortype;
  exr_attr_box2i_t dw;
  int32_t scansperchunk;
  void *ptr;
  exr_chunk_info_t cinfo;
  exr_decode_pipeline_t decoder;
  uint local_298;
  uint local_294;
  int local_290;
  int local_28c;
  int local_288;
  int local_284;
  int local_280;
  int local_27c;
  exr_context_t local_278;
  void *local_270;
  char local_268 [64];
  char local_228 [8];
  long local_220;
  short local_218;
  
  pcVar8 = (char *)CONCAT44(in_register_0000000c,ys);
  iVar3 = exr_get_data_window(f,0,&local_28c);
  if (iVar3 != 0) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar6 = (char *)exr_get_default_error_message(iVar3);
    poVar5 = std::operator<<(poVar5,pcVar6);
    std::endl<char,std::char_traits<char>>(poVar5);
    core_test_fail("exr_get_data_window (f, 0, &dw)",(char *)0x38f,0x156824,pcVar8);
  }
  if (local_28c != xs * 0x11) {
    core_test_fail("dw.min.x == IMG_DATA_X * xs",(char *)0x390,0x156824,pcVar8);
  }
  if (local_284 != xs * 0x56c + -1) {
    core_test_fail("dw.max.x == IMG_DATA_X * xs + IMG_WIDTH * xs - 1",(char *)0x391,0x156824,pcVar8)
    ;
  }
  if (local_288 != ys * 0x1d) {
    core_test_fail("dw.min.y == IMG_DATA_Y * ys",(char *)0x392,0x156824,pcVar8);
  }
  if (local_280 != ys * 0xbc + -1) {
    core_test_fail("dw.max.y == IMG_DATA_Y * ys + IMG_HEIGHT * ys - 1",(char *)0x393,0x156824,pcVar8
                  );
  }
  iVar3 = exr_get_scanlines_per_chunk(f,0,&local_27c);
  if (iVar3 != 0) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar6 = (char *)exr_get_default_error_message(iVar3);
    poVar5 = std::operator<<(poVar5,pcVar6);
    std::endl<char,std::char_traits<char>>(poVar5);
    core_test_fail("exr_get_scanlines_per_chunk (f, 0, &scansperchunk)",(char *)0x395,0x156824,
                   pcVar8);
  }
  iVar3 = exr_get_storage(f,0,&local_290);
  if (iVar3 != 0) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar6 = (char *)exr_get_default_error_message(iVar3);
    poVar5 = std::operator<<(poVar5,pcVar6);
    std::endl<char,std::char_traits<char>>(poVar5);
    core_test_fail("exr_get_storage (f, 0, &stortype)",(char *)0x398,0x156824,pcVar8);
  }
  if (local_290 == 0) {
    bVar1 = true;
    iVar3 = local_288;
    local_278 = f;
    while( true ) {
      if (local_280 < iVar3) {
        iVar3 = exr_decoding_destroy(f,local_228);
        if (iVar3 == 0) {
          return;
        }
        poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
        poVar5 = std::operator<<(poVar5,") ");
        pcVar6 = (char *)exr_get_default_error_message(iVar3);
        poVar5 = std::operator<<(poVar5,pcVar6);
        std::endl<char,std::char_traits<char>>(poVar5);
        core_test_fail("exr_decoding_destroy (f, &decoder)",(char *)0x3cd,0x156824,pcVar8);
      }
      pcVar8 = local_268;
      iVar4 = exr_read_scanline_chunk_info(f,0,iVar3);
      if (iVar4 != 0) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar4);
        poVar5 = std::operator<<(poVar5,") ");
        pcVar6 = (char *)exr_get_default_error_message(iVar4);
        poVar5 = std::operator<<(poVar5,pcVar6);
        std::endl<char,std::char_traits<char>>(poVar5);
        core_test_fail("exr_read_scanline_chunk_info (f, 0, y, &cinfo)",(char *)0x39e,0x156824,
                       pcVar8);
      }
      if (bVar1) {
        pcVar8 = local_228;
        iVar4 = exr_decoding_initialize(f,0,local_268);
        if (iVar4 != 0) {
          poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar4);
          poVar5 = std::operator<<(poVar5,") ");
          pcVar6 = (char *)exr_get_default_error_message(iVar4);
          poVar5 = std::operator<<(poVar5,pcVar6);
          std::endl<char,std::char_traits<char>>(poVar5);
          core_test_fail("exr_decoding_initialize (f, 0, &cinfo, &decoder)",(char *)0x3a2,0x156824,
                         pcVar8);
        }
      }
      else {
        pcVar8 = local_228;
        iVar4 = exr_decoding_update(f,0,local_268);
        if (iVar4 != 0) {
          poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar4);
          poVar5 = std::operator<<(poVar5,") ");
          pcVar6 = (char *)exr_get_default_error_message(iVar4);
          poVar5 = std::operator<<(poVar5,pcVar6);
          std::endl<char,std::char_traits<char>>(poVar5);
          core_test_fail("exr_decoding_update (f, 0, &cinfo, &decoder)",(char *)0x3a6,0x156824,
                         pcVar8);
        }
      }
      iVar9 = iVar3 - local_288;
      iVar4 = p->_stride_x;
      lVar11 = 0;
      for (lVar10 = 0; lVar2 = local_220, f = local_278, lVar10 < local_218; lVar10 = lVar10 + 1) {
        if (*(int *)(local_220 + 8 + lVar11) == 0) {
          *(undefined8 *)(local_220 + 0x28 + lVar11) = 0;
          *(undefined4 *)(local_220 + 0x20 + lVar11) = 0;
          pcVar8 = (char *)0x0;
        }
        else {
          fill_pointers(p,(exr_coding_channel_info_t *)(local_220 + lVar11),(iVar9 / ys) * iVar4,
                        &local_270,(int32_t *)&local_294,(int32_t *)&local_298);
          uVar7 = (uint)*(short *)(lVar2 + 0x1c + lVar11);
          if (local_294 != uVar7) {
            core_test_fail("curchan.user_bytes_per_element == pixelstride",(char *)0x3bd,0x156824,
                           (char *)(ulong)uVar7);
          }
          *(void **)(local_220 + 0x28 + lVar11) = local_270;
          *(uint *)(local_220 + 0x20 + lVar11) = uVar7;
          pcVar8 = (char *)(ulong)local_298;
        }
        *(int *)(local_220 + 0x24 + lVar11) = (int)pcVar8;
        lVar11 = lVar11 + 0x30;
      }
      if (bVar1) {
        iVar4 = exr_decoding_choose_default_routines(local_278,0,local_228);
        if (iVar4 != 0) {
          poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar4);
          poVar5 = std::operator<<(poVar5,") ");
          pcVar6 = (char *)exr_get_default_error_message(iVar4);
          poVar5 = std::operator<<(poVar5,pcVar6);
          std::endl<char,std::char_traits<char>>(poVar5);
          core_test_fail("exr_decoding_choose_default_routines (f, 0, &decoder)",(char *)0x3c7,
                         0x156824,pcVar8);
        }
      }
      iVar4 = exr_decoding_run(f,0,local_228);
      if (iVar4 != 0) break;
      iVar3 = iVar3 + local_27c;
      bVar1 = false;
    }
    poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar4);
    poVar5 = std::operator<<(poVar5,") ");
    pcVar6 = (char *)exr_get_default_error_message(iVar4);
    poVar5 = std::operator<<(poVar5,pcVar6);
    std::endl<char,std::char_traits<char>>(poVar5);
    core_test_fail("exr_decoding_run (f, 0, &decoder)",(char *)0x3c9,0x156824,pcVar8);
  }
  core_test_fail("stortype == EXR_STORAGE_SCANLINE",(char *)0x399,0x156824,pcVar8);
}

Assistant:

static void
doDecodeScan (exr_context_t f, pixels& p, int xs, int ys)
{
    exr_chunk_info_t      cinfo;
    exr_decode_pipeline_t decoder;
    int32_t               scansperchunk;
    exr_attr_box2i_t      dw;
    bool                  first = true;

    EXRCORE_TEST_RVAL (exr_get_data_window (f, 0, &dw));
    EXRCORE_TEST (dw.min.x == IMG_DATA_X * xs);
    EXRCORE_TEST (dw.max.x == IMG_DATA_X * xs + IMG_WIDTH * xs - 1);
    EXRCORE_TEST (dw.min.y == IMG_DATA_Y * ys);
    EXRCORE_TEST (dw.max.y == IMG_DATA_Y * ys + IMG_HEIGHT * ys - 1);

    EXRCORE_TEST_RVAL (exr_get_scanlines_per_chunk (f, 0, &scansperchunk));

    exr_storage_t stortype;
    EXRCORE_TEST_RVAL (exr_get_storage (f, 0, &stortype));
    EXRCORE_TEST (stortype == EXR_STORAGE_SCANLINE);

    //const uint8_t* tmp;
    for (int y = dw.min.y; y <= dw.max.y; y += scansperchunk)
    {
        EXRCORE_TEST_RVAL (exr_read_scanline_chunk_info (f, 0, y, &cinfo));
        if (first)
        {
            EXRCORE_TEST_RVAL (
                exr_decoding_initialize (f, 0, &cinfo, &decoder));
        }
        else
        {
            EXRCORE_TEST_RVAL (exr_decoding_update (f, 0, &cinfo, &decoder));
        }
        int32_t idxoffset = ((y - dw.min.y) / ys) * p._stride_x;

        for (int c = 0; c < decoder.channel_count; ++c)
        {
            const exr_coding_channel_info_t& curchan = decoder.channels[c];
            void*                            ptr;
            int32_t                          pixelstride;
            int32_t                          linestride;

            if (curchan.height == 0)
            {
                decoder.channels[c].decode_to_ptr     = NULL;
                decoder.channels[c].user_pixel_stride = 0;
                decoder.channels[c].user_line_stride  = 0;
                continue;
            }

            fill_pointers (
                p, curchan, idxoffset, &ptr, &pixelstride, &linestride);

            // make sure the setup has initialized our bytes for us
            EXRCORE_TEST (curchan.user_bytes_per_element == pixelstride);

            decoder.channels[c].decode_to_ptr     = (uint8_t*) ptr;
            decoder.channels[c].user_pixel_stride = pixelstride;
            decoder.channels[c].user_line_stride  = linestride;
        }

        if (first)
        {
            EXRCORE_TEST_RVAL (
                exr_decoding_choose_default_routines (f, 0, &decoder));
        }
        EXRCORE_TEST_RVAL (exr_decoding_run (f, 0, &decoder));

        first = false;
    }
    EXRCORE_TEST_RVAL (exr_decoding_destroy (f, &decoder));
}